

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::Simple8b<true>::decodeArray
          (Simple8b<true> *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  undefined8 uVar2;
  logic_error *plVar3;
  uint *puVar4;
  uint32_t *in_RCX;
  uint *in_RSI;
  ulong *in_R8;
  uint32_t *initout;
  uint32_t *end;
  uint64_t *in64;
  size_t actualvalue;
  uint32_t markednvalue;
  size_t in_stack_fffffffffffffef8;
  NotEnoughStorage *in_stack_ffffffffffffff00;
  uint local_d8;
  uint local_d4 [3];
  uint local_c8;
  uint local_c4 [3];
  uint local_b8;
  uint local_b4 [3];
  uint local_a8;
  uint local_a4 [3];
  uint local_98;
  uint local_94 [3];
  uint local_88;
  uint local_84 [3];
  uint local_78;
  uint local_74 [3];
  uint local_68;
  uint local_64;
  uint32_t *local_60;
  uint32_t *local_58;
  uint64_t *local_50;
  ulong local_48;
  uint local_2c;
  ulong *local_28;
  uint32_t *local_20 [2];
  uint64_t *local_10;
  
  local_50 = (uint64_t *)(in_RSI + 1);
  local_2c = *in_RSI;
  local_10 = local_50;
  if ((ulong)local_2c <= *in_R8) {
    local_48 = (ulong)local_2c;
    local_28 = in_R8;
    local_20[0] = in_RCX;
    if (*in_R8 < local_48) {
      fprintf(_stderr,"possible overrun\n");
    }
    *local_28 = local_48;
    local_58 = local_20[0] + *local_28;
    local_60 = local_20[0];
    while (local_20[0] + 0xf0 < local_58) {
      uVar1 = which(local_50);
      switch(uVar1) {
      case 0:
        unpack<240u,0u>(local_20,&local_50);
        break;
      case 1:
        unpack<120u,0u>(local_20,&local_50);
        break;
      case 2:
        unpack<60u,1u>(local_20,&local_50);
        break;
      case 3:
        unpack<30u,2u>(local_20,&local_50);
        break;
      case 4:
        unpack<20u,3u>(local_20,&local_50);
        break;
      case 5:
        unpack<15u,4u>(local_20,&local_50);
        break;
      case 6:
        unpack<12u,5u>(local_20,&local_50);
        break;
      case 7:
        unpack<10u,6u>(local_20,&local_50);
        break;
      case 8:
        unpack<8u,7u>(local_20,&local_50);
        break;
      case 9:
        unpack<7u,8u>(local_20,&local_50);
        break;
      case 10:
        unpack<6u,10u>(local_20,&local_50);
        break;
      case 0xb:
        unpack<5u,12u>(local_20,&local_50);
        break;
      case 0xc:
        unpack<4u,15u>(local_20,&local_50);
        break;
      case 0xd:
        unpack<3u,20u>(local_20,&local_50);
        break;
      case 0xe:
        unpack<2u,30u>(local_20,&local_50);
        break;
      case 0xf:
        unpack<1u,60u>(local_20,&local_50);
        break;
      default:
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"hmmm how could that happen?");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    while (local_20[0] < local_58) {
      uVar1 = which(local_50);
      switch(uVar1) {
      case 0:
        local_64 = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_68 = 0xf0;
        puVar4 = std::min<unsigned_int>(&local_64,&local_68);
        carefulunpack<0u>(*puVar4,local_20,&local_50);
        break;
      case 1:
        local_74[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_74[1] = 0x78;
        puVar4 = std::min<unsigned_int>(local_74 + 2,local_74 + 1);
        carefulunpack<0u>(*puVar4,local_20,&local_50);
        break;
      case 2:
        local_74[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_78 = 0x3c;
        puVar4 = std::min<unsigned_int>(local_74,&local_78);
        carefulunpack<1u>(*puVar4,local_20,&local_50);
        break;
      case 3:
        local_84[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_84[1] = 0x1e;
        puVar4 = std::min<unsigned_int>(local_84 + 2,local_84 + 1);
        carefulunpack<2u>(*puVar4,local_20,&local_50);
        break;
      case 4:
        local_84[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_88 = 0x14;
        puVar4 = std::min<unsigned_int>(local_84,&local_88);
        carefulunpack<3u>(*puVar4,local_20,&local_50);
        break;
      case 5:
        local_94[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_94[1] = 0xf;
        puVar4 = std::min<unsigned_int>(local_94 + 2,local_94 + 1);
        carefulunpack<4u>(*puVar4,local_20,&local_50);
        break;
      case 6:
        local_94[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_98 = 0xc;
        puVar4 = std::min<unsigned_int>(local_94,&local_98);
        carefulunpack<5u>(*puVar4,local_20,&local_50);
        break;
      case 7:
        local_a4[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_a4[1] = 10;
        puVar4 = std::min<unsigned_int>(local_a4 + 2,local_a4 + 1);
        carefulunpack<6u>(*puVar4,local_20,&local_50);
        break;
      case 8:
        local_a4[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_a8 = 8;
        puVar4 = std::min<unsigned_int>(local_a4,&local_a8);
        carefulunpack<7u>(*puVar4,local_20,&local_50);
        break;
      case 9:
        local_b4[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_b4[1] = 7;
        puVar4 = std::min<unsigned_int>(local_b4 + 2,local_b4 + 1);
        carefulunpack<8u>(*puVar4,local_20,&local_50);
        break;
      case 10:
        local_b4[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_b8 = 6;
        puVar4 = std::min<unsigned_int>(local_b4,&local_b8);
        carefulunpack<10u>(*puVar4,local_20,&local_50);
        break;
      case 0xb:
        local_c4[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_c4[1] = 5;
        puVar4 = std::min<unsigned_int>(local_c4 + 2,local_c4 + 1);
        carefulunpack<12u>(*puVar4,local_20,&local_50);
        break;
      case 0xc:
        local_c4[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_c8 = 4;
        puVar4 = std::min<unsigned_int>(local_c4,&local_c8);
        carefulunpack<15u>(*puVar4,local_20,&local_50);
        break;
      case 0xd:
        local_d4[2] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_d4[1] = 3;
        puVar4 = std::min<unsigned_int>(local_d4 + 2,local_d4 + 1);
        carefulunpack<20u>(*puVar4,local_20,&local_50);
        break;
      case 0xe:
        local_d4[0] = (uint)((long)local_58 - (long)local_20[0] >> 2);
        local_d8 = 2;
        puVar4 = std::min<unsigned_int>(local_d4,&local_d8);
        carefulunpack<30u>(*puVar4,local_20,&local_50);
        break;
      case 0xf:
        carefulunpack<60u>(1,local_20,&local_50);
        break;
      default:
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"hmmm how could that happen?");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    *local_28 = local_48;
    return (uint32_t *)local_50;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  __cxa_throw(uVar2,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
}

Assistant:

const uint32_t *Simple8b<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  // const uint32_t * const initin(in);
  const uint32_t *const endin(in + len);
#endif
#ifdef STATS
  std::vector<uint32_t> stats(16, 0);
#endif
  uint32_t markednvalue;
  if (MarkLength) {
    markednvalue = *in++;
    if (markednvalue > nvalue)
      throw NotEnoughStorage(markednvalue);
  }
  const size_t actualvalue = MarkLength ? markednvalue : nvalue;
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  const uint64_t *in64 = reinterpret_cast<const uint64_t *>(in);
#ifndef NDEBUG
  const uint64_t *finalin64 = reinterpret_cast<const uint64_t *>(endin);
#endif

  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
  const uint32_t *const end = out + nvalue;
  const uint32_t *const initout(out);
  while (end > out + 240) {
#ifdef STATS
    stats[which(in64)]++;
#endif
    switch (which(in64)) {
    case 0:
      unpack<240, 0>(out, in64);
      break;
    case 1:
      unpack<120, 0>(out, in64);
      break;
    case 2:
      unpack<60, 1>(out, in64);
      break;
    case 3:
      unpack<30, 2>(out, in64);
      break;
    case 4:
      unpack<20, 3>(out, in64);
      break;
    case 5:
      unpack<15, 4>(out, in64);
      break;
    case 6:
      unpack<12, 5>(out, in64);
      break;
    case 7:
      unpack<10, 6>(out, in64);
      break;
    case 8:
      unpack<8, 7>(out, in64);
      break;
    case 9:
      unpack<7, 8>(out, in64);
      break;
    case 10:
      unpack<6, 10>(out, in64);
      break;
    case 11:
      unpack<5, 12>(out, in64);
      break;
    case 12:
      unpack<4, 15>(out, in64);
      break;
    case 13:
      unpack<3, 20>(out, in64);
      break;
    case 14:
      unpack<2, 30>(out, in64);
      break;
    case 15:
      unpack<1, 60>(out, in64);
      break;
    default:
      throw std::logic_error("hmmm how could that happen?");
    }
  }
  while (end > out) {
#ifdef STATS
    stats[which(in64)]++;
#endif
    switch (which(in64)) {
    case 0:
      carefulunpack<0>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 240), out, in64);
      break;
    case 1:
      carefulunpack<0>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 120), out, in64);
      break;
    case 2:
      carefulunpack<1>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 60), out, in64);
      break;
    case 3:
      carefulunpack<2>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 30), out, in64);
      break;
    case 4:
      carefulunpack<3>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 20), out, in64);
      break;
    case 5:
      carefulunpack<4>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 15), out, in64);
      break;
    case 6:
      carefulunpack<5>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 12), out, in64);
      break;
    case 7:
      carefulunpack<6>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 10), out, in64);
      break;
    case 8:
      carefulunpack<7>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 8), out, in64);
      break;
    case 9:
      carefulunpack<8>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 7), out, in64);
      break;
    case 10:
      carefulunpack<10>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 6), out, in64);
      break;
    case 11:
      carefulunpack<12>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 5), out, in64);
      break;
    case 12:
      carefulunpack<15>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 4), out, in64);
      break;
    case 13:
      carefulunpack<20>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 3), out, in64);
      break;
    case 14:
      carefulunpack<30>(std::min<uint32_t>(static_cast<uint32_t>(end - out), 2), out, in64);
      break;
    case 15:
      carefulunpack<60>(1, out, in64);
      break;
    default:
      throw std::logic_error("hmmm how could that happen?");
    }
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple8b stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  assert(in64 <= finalin64);
  in = reinterpret_cast<const uint32_t *>(in64);
  assert(in <= endin);
  // check that we don't overrun the buffer too much?
  ASSERT(out < end + 240, std::to_string(out - end));
  nvalue = MarkLength ? actualvalue : out - initout;
  return in;
}